

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_63917::data<float>::writeData(data<float> *this,DeepScanLineOutputPart *part)

{
  value_type vVar1;
  value_type vVar2;
  ulong uVar3;
  size_type sVar4;
  size_t sVar5;
  const_reference pvVar6;
  reference pvVar7;
  const_reference this_00;
  const_reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference ppfVar12;
  ostream *this_01;
  ostream *poVar13;
  ostream *poVar14;
  size_type sVar15;
  const_reference pvVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t c_1;
  DeepFrameBuffer fb;
  size_t s;
  size_t c;
  size_t count;
  size_t p;
  size_t sample;
  size_t pixel;
  size_t i;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  sample_buffers;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  sample_pointers;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counts;
  size_t sample_buffer_size;
  size_t repeats;
  size_t output_pixels;
  Box2i dw;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 uVar17;
  int in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  size_type in_stack_fffffffffffffd28;
  DeepFrameBuffer *in_stack_fffffffffffffd30;
  undefined2 uVar20;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 uVar21;
  reference b;
  size_type in_stack_fffffffffffffd88;
  size_type local_1a8;
  int local_1a0;
  int local_198;
  Slice local_190 [2];
  ulong local_f0;
  ulong local_e8;
  size_type local_e0;
  ulong local_d8;
  size_type local_d0;
  size_type local_c8;
  ulong local_c0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_b0;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  local_90 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  long local_48;
  long local_40;
  int local_34;
  int local_30;
  ulong local_28;
  int local_20;
  int local_1c;
  
  Imf_2_5::DeepScanLineOutputPart::header((DeepScanLineOutputPart *)0x141fd4);
  Imf_2_5::Header::dataWindow((Header *)0x141fdc);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  uVar3 = (ulong)((local_30 + 1) * (local_34 + 1));
  local_28 = uVar3;
  sVar4 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)(in_RDI + 2));
  local_40 = uVar3 / sVar4 + 1;
  sVar5 = totalSamples((data<float> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20))
  ;
  local_48 = sVar5 * local_40;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1420cd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1420f9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(in_RDI);
  std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>::allocator
            ((allocator<std::vector<float_*,_std::allocator<float_*>_>_> *)0x142123);
  std::
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  ::vector((vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
            *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>::~allocator
            ((allocator<std::vector<float_*,_std::allocator<float_*>_>_> *)0x14214f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(in_RDI);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x142179);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1421a5);
  local_c0 = 0;
  while( true ) {
    uVar3 = local_c0;
    sVar4 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(&local_b0);
    if (sVar4 <= uVar3) break;
    std::
    vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ::operator[](local_90,local_c0);
    std::vector<float_*,_std::allocator<float_*>_>::resize
              ((vector<float_*,_std::allocator<float_*>_> *)in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[](&local_b0,local_c0);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28);
    local_c0 = local_c0 + 1;
  }
  local_c8 = 0;
  local_d0 = 0;
  for (local_d8 = 0; local_d8 < local_28; local_d8 = local_d8 + 1) {
    pvVar6 = std::
             vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                           *)&in_RDI[5].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,local_c8);
    local_e0 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::size(pvVar6);
    vVar2 = (value_type)local_e0;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_60,local_d8);
    *pvVar7 = vVar2;
    if (local_e0 != 0) {
      local_e8 = 0;
      while( true ) {
        uVar3 = local_e8;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI);
        if (sVar4 <= uVar3) break;
        for (local_f0 = 0; local_f0 < local_e0; local_f0 = local_f0 + 1) {
          pvVar6 = std::
                   vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                 *)&in_RDI[5].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,local_c8);
          this_00 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](pvVar6,local_f0);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](this_00,local_e8);
          vVar1 = *pvVar8;
          pvVar9 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](&local_b0,local_e8);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              (pvVar9,local_d0 + local_f0);
          *pvVar10 = vVar1;
        }
        pvVar9 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](&local_b0,local_e8);
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](pvVar9,local_d0);
        pvVar11 = std::
                  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                  ::operator[](local_90,local_e8);
        ppfVar12 = std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar11,local_d8);
        *ppfVar12 = pvVar10;
        local_e8 = local_e8 + 1;
      }
      local_d0 = local_e0 + local_d0;
    }
    in_stack_fffffffffffffd88 = local_c8 + 1;
    local_c8 = in_stack_fffffffffffffd88;
    sVar4 = std::
            vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
            ::size((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                    *)&in_RDI[5].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (in_stack_fffffffffffffd88 == sVar4) {
      local_c8 = 0;
    }
  }
  this_01 = std::operator<<((ostream *)&std::cout," wrote ");
  poVar13 = (ostream *)std::ostream::operator<<(this_01,local_d0);
  poVar13 = std::operator<<(poVar13," samples  into ");
  poVar14 = (ostream *)std::ostream::operator<<(poVar13,local_28);
  std::operator<<(poVar14," pixels\n");
  Imf_2_5::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffd30);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_60,0);
  pvVar7 = pvVar7 + -(long)local_20;
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  b = pvVar7 + -(long)((local_198 + 1) * local_1c);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  uVar19 = 0;
  uVar18 = 0;
  uVar17 = 1;
  Imf_2_5::Slice::Slice(local_190,UINT,(char *)b,4,(long)local_1a0 * 4 + 4,1,1,0.0,false,false);
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
            ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (Slice *)CONCAT44(in_stack_fffffffffffffd1c,uVar19));
  local_1a8 = 0;
  while( true ) {
    sVar4 = local_1a8;
    sVar15 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(in_RDI);
    if (sVar15 <= sVar4) break;
    pvVar16 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](in_RDI,local_1a8);
    uVar20 = (undefined2)((ulong)pvVar16 >> 0x30);
    uVar21 = *(undefined4 *)
              &in_RDI[6].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pvVar11 = std::
              vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
              ::operator[](local_90,local_1a8);
    ppfVar12 = std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar11,0);
    ppfVar12 = ppfVar12 + -(long)local_20;
    Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
              ((Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffd1c,uVar19));
    Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
              ((Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffd1c,uVar19));
    in_stack_fffffffffffffd20 = 0;
    uVar19 = 0;
    uVar18 = 1;
    uVar17 = 1;
    Imf_2_5::DeepSlice::DeepSlice
              ((DeepSlice *)poVar13,(PixelType)((ulong)poVar14 >> 0x20),(char *)pvVar7,(size_t)b,
               sVar4,(size_t)ppfVar12,(int)this_01,(int)in_stack_fffffffffffffd88,
               (double)CONCAT44(uVar21,in_stack_fffffffffffffd40),SUB21((ushort)uVar20 >> 8,0),
               SUB21(uVar20,0));
    Imf_2_5::DeepFrameBuffer::insert
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               (string *)CONCAT44(in_stack_fffffffffffffd1c,uVar19),
               (DeepSlice *)CONCAT44(in_stack_fffffffffffffd14,uVar18));
    local_1a8 = local_1a8 + 1;
  }
  Imf_2_5::DeepScanLineOutputPart::setFrameBuffer
            ((DeepScanLineOutputPart *)CONCAT44(in_stack_fffffffffffffd14,uVar18),
             (DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffd0c,uVar17));
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
            ((Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffd1c,uVar19));
  Imf_2_5::DeepScanLineOutputPart::writePixels
            ((DeepScanLineOutputPart *)CONCAT44(in_stack_fffffffffffffd14,uVar18),
             in_stack_fffffffffffffd0c);
  Imf_2_5::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1428d0);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  std::
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  ::~vector((vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  return;
}

Assistant:

void 
    writeData(DeepScanLineOutputPart & part) const
    {
        Box2i dw=part.header().dataWindow();
        size_t output_pixels = (dw.size().x+1)*(dw.size().y+1);
        
        // how many times we'll write the same pattern
        size_t repeats = 1+(output_pixels/_results.size());
        
        size_t sample_buffer_size = totalSamples()*repeats;
        
        // buffer for sample counts
        vector<unsigned int> counts(output_pixels);
        
        // buffers for sample pointers
        vector< vector<T *> > sample_pointers(_channels.size());
        
        // buffer for actual sample data
        vector< vector<T> > sample_buffers(_channels.size());
        
        for(size_t i=0;i<sample_buffers.size();i++)
        {
            sample_pointers[i].resize(output_pixels);
            sample_buffers[i].resize(sample_buffer_size);
        }
        
        
        size_t pixel=0; // which pixel we are currently writing
        size_t sample=0; // which sample we are currently writing into
        
        for(size_t p=0;p<output_pixels;p++)
        {
            size_t count = _samples[pixel].size();
            counts[p]=count;
            if( count>0 )
            {
                for(size_t c=0 ; c<_channels.size() ; c++)
                {
                    for(size_t s=0 ; s < count ; s++ )
                    {
                        sample_buffers[c][sample+s]=_samples[pixel][s][c];
                    }
                    sample_pointers[c][p]=&sample_buffers[c][sample];
                }
                sample+=count;
            }
            pixel++;
            if(pixel==_samples.size()) pixel=0;
        }
        cout << " wrote " << sample << " samples  into " << output_pixels << " pixels\n";
        
        DeepFrameBuffer fb;
        fb.insertSampleCountSlice(Slice(UINT,
                                        (char *)(&counts[0]-dw.min.x-(dw.size().x+1)*dw.min.y),
                                        sizeof(unsigned int),
                                        sizeof(unsigned int)*(dw.size().x+1)
                                        )
                                  );
        for(size_t c=0;c<_channels.size();c++)
        {
            fb.insert(_channels[c],
                      DeepSlice(_type,(char *)(&sample_pointers[c][0]-dw.min.x-(dw.size().x+1)*dw.min.y),
                            sizeof(T *),
                            sizeof(T *)*(dw.size().x+1),
                            sizeof(T)
                            )
                     );
        }
        part.setFrameBuffer(fb);
        part.writePixels(dw.size().y+1);
        
    }